

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall
Assimp::FBXExporter::WriteModelNodes
          (FBXExporter *this,StreamWriterLE *outstream,aiNode *node,int64_t parent_uid,
          unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
          *limbnodes,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          *transform_chain)

{
  size_t sVar1;
  iterator iVar2;
  undefined8 uVar3;
  int64_t iVar4;
  aiNode *paVar5;
  bool bVar6;
  char *pcVar7;
  long lVar8;
  ostream *poVar9;
  pointer ppVar10;
  DeadlyImportError *pDVar11;
  pointer ppVar12;
  _Base_ptr p_Var13;
  mapped_type_conflict2 *pmVar14;
  size_type sVar15;
  reference pvVar16;
  ulong local_7c8;
  size_t i_2;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  undefined1 local_770 [8];
  Node p;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  allocator<char> local_691;
  string local_690 [8];
  string name;
  string local_668;
  undefined1 local_648 [8];
  Node m;
  int64_t new_node_uid;
  size_t i_1;
  string local_5c0;
  FBXExportProperty local_5a0;
  allocator<char> local_579;
  string local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  allocator<char> local_531;
  string local_530;
  undefined1 local_510 [8];
  Node na;
  int64_t node_attribute_uid;
  string local_490;
  allocator<char> local_469;
  string local_468;
  _Self local_448;
  _Self local_440;
  iterator elem_1;
  int64_t node_uid;
  uint local_428;
  uint i;
  stringstream local_400 [8];
  stringstream err_1;
  ostream local_3f0 [376];
  undefined1 local_278 [8];
  aiVector3D s;
  aiVector3D r;
  aiVector3D t;
  stringstream local_230 [8];
  stringstream err;
  ostream local_220 [376];
  _Self local_a8;
  _Self local_a0;
  const_iterator elem;
  string type_name;
  size_type pos;
  allocator<char> local_59;
  string local_58 [8];
  string node_name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
  *transform_chain_local;
  unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
  *limbnodes_local;
  int64_t parent_uid_local;
  aiNode *node_local;
  StreamWriterLE *outstream_local;
  FBXExporter *this_local;
  
  node_name.field_2._8_8_ = transform_chain;
  limbnodes_local =
       (unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
        *)parent_uid;
  parent_uid_local = (int64_t)node;
  node_local = (aiNode *)outstream;
  outstream_local = (StreamWriterLE *)this;
  pcVar7 = aiString::C_Str(&node->mName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,pcVar7,&local_59);
  std::allocator<char>::~allocator(&local_59);
  lVar8 = std::__cxx11::string::find(local_58,0x101cee0);
  if (lVar8 == -1) {
    elem_1._M_node = (_Base_ptr)0x0;
    if ((aiNode *)parent_uid_local != this->mScene->mRootNode) {
      local_440._M_node =
           (_Base_ptr)
           std::
           map<const_aiNode_*,_long,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
           ::find(&this->node_uids,(key_type *)&parent_uid_local);
      local_448._M_node =
           (_Base_ptr)
           std::
           map<const_aiNode_*,_long,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
           ::end(&this->node_uids);
      bVar6 = std::operator!=(&local_440,&local_448);
      if (bVar6) {
        ppVar12 = std::_Rb_tree_iterator<std::pair<const_aiNode_*const,_long>_>::operator->
                            (&local_440);
        elem_1._M_node = (_Base_ptr)ppVar12->second;
      }
      else {
        p_Var13 = (_Base_ptr)generate_uid(this);
        elem_1._M_node = p_Var13;
        pmVar14 = std::
                  map<const_aiNode_*,_long,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
                  ::operator[](&this->node_uids,(key_type *)&parent_uid_local);
        *pmVar14 = (mapped_type_conflict2)p_Var13;
      }
      std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
      emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
                 (char (*) [2])0xbab3fd,(char (*) [3])"OO",(long *)&elem_1,(long *)&limbnodes_local)
      ;
    }
    if ((aiNode *)parent_uid_local != this->mScene->mRootNode) {
      if (*(int *)(parent_uid_local + 0x460) == 1) {
        pvVar16 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&this->mesh_uids,(ulong)**(uint **)(parent_uid_local + 0x468));
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections
                   ,(char (*) [2])0xbab3fd,(char (*) [3])"OO",pvVar16,(long *)&elem_1);
        pvVar16 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&this->material_uids,
                             (ulong)this->mScene->mMeshes[**(uint **)(parent_uid_local + 0x468)]->
                                    mMaterialIndex);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections
                   ,(char (*) [2])0xbab3fd,(char (*) [3])"OO",pvVar16,(long *)&elem_1);
        paVar5 = node_local;
        iVar4 = parent_uid_local;
        iVar2 = elem_1;
        bVar6 = this->binary;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"Mesh",&local_469);
        WriteModelNode(this,(StreamWriterLE *)paVar5,(bool)(bVar6 & 1),(aiNode *)iVar4,
                       (int64_t)iVar2._M_node,&local_468,
                       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
                        *)node_name.field_2._8_8_,TransformInheritance_RSrs);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator(&local_469);
      }
      else {
        sVar15 = std::
                 unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
                 ::count(limbnodes,(key_type *)&parent_uid_local);
        paVar5 = node_local;
        iVar4 = parent_uid_local;
        iVar2 = elem_1;
        if (sVar15 == 0) {
          bVar6 = this->binary;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,"Null",(allocator<char> *)((long)&i_1 + 7));
          WriteModelNode(this,(StreamWriterLE *)paVar5,(bool)(bVar6 & 1),(aiNode *)iVar4,
                         (int64_t)iVar2._M_node,&local_5c0,
                         (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
                          *)node_name.field_2._8_8_,TransformInheritance_RSrs);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
        }
        else {
          bVar6 = this->binary;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_490,"LimbNode",
                     (allocator<char> *)((long)&node_attribute_uid + 7));
          WriteModelNode(this,(StreamWriterLE *)paVar5,(bool)(bVar6 & 1),(aiNode *)iVar4,
                         (int64_t)iVar2._M_node,&local_490,
                         (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
                          *)node_name.field_2._8_8_,TransformInheritance_RSrs);
          std::__cxx11::string::~string((string *)&local_490);
          std::allocator<char>::~allocator((allocator<char> *)((long)&node_attribute_uid + 7));
          na.property_start = generate_uid(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"NodeAttribute",&local_531);
          FBX::Node::Node((Node *)local_510,&local_530);
          std::__cxx11::string::~string((string *)&local_530);
          std::allocator<char>::~allocator(&local_531);
          sVar1 = na.property_start;
          std::operator+(&local_558,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         FBX::SEPARATOR_abi_cxx11_,"NodeAttribute");
          FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
                    ((Node *)local_510,sVar1,&local_558,"LimbNode");
          std::__cxx11::string::~string((string *)&local_558);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"TypeFlags",&local_579);
          FBX::FBXExportProperty::FBXExportProperty(&local_5a0,"Skeleton",false);
          FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>
                    ((Node *)local_510,&local_578,&local_5a0);
          FBX::FBXExportProperty::~FBXExportProperty(&local_5a0);
          std::__cxx11::string::~string((string *)&local_578);
          std::allocator<char>::~allocator(&local_579);
          FBX::Node::Dump((Node *)local_510,(StreamWriterLE *)node_local,(bool)(this->binary & 1),1)
          ;
          std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
          emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                    ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)
                     &this->connections,(char (*) [2])0xbab3fd,(char (*) [3])"OO",
                     (long *)&na.property_start,(long *)&elem_1);
          FBX::Node::~Node((Node *)local_510);
        }
      }
    }
    if ((1 < *(uint *)(parent_uid_local + 0x460)) ||
       ((aiNode *)parent_uid_local == this->mScene->mRootNode)) {
      for (new_node_uid = 0; (ulong)new_node_uid < (ulong)*(uint *)(parent_uid_local + 0x460);
          new_node_uid = new_node_uid + 1) {
        m.property_start = generate_uid(this);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections
                   ,(char (*) [2])0xbab3fd,(char (*) [3])"OO",(long *)&m.property_start,
                   (long *)&elem_1);
        pvVar16 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&this->mesh_uids,
                             (ulong)*(uint *)(*(long *)(parent_uid_local + 0x468) + new_node_uid * 4
                                             ));
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections
                   ,(char (*) [2])0xbab3fd,(char (*) [3])"OO",pvVar16,(long *)&m.property_start);
        pvVar16 = std::vector<long,_std::allocator<long>_>::operator[]
                            (&this->material_uids,
                             (ulong)this->mScene->mMeshes
                                    [*(uint *)(*(long *)(parent_uid_local + 0x468) +
                                              new_node_uid * 4)]->mMaterialIndex);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections
                   ,(char (*) [2])0xbab3fd,(char (*) [3])"OO",pvVar16,(long *)&m.property_start);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"Model",(allocator<char> *)(name.field_2._M_local_buf + 0xf)
                  );
        FBX::Node::Node((Node *)local_648,&local_668);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
        pcVar7 = aiString::C_Str(&this->mScene->mMeshes
                                  [*(uint *)(*(long *)(parent_uid_local + 0x468) + new_node_uid * 4)
                                  ]->mName);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_690,pcVar7,&local_691);
        std::allocator<char>::~allocator(&local_691);
        std::operator+(&local_6b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FBX::SEPARATOR_abi_cxx11_,"Model");
        std::__cxx11::string::operator+=(local_690,(string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_6b8);
        sVar1 = m.property_start;
        std::__cxx11::string::string((string *)&local_6d8,local_690);
        FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
                  ((Node *)local_648,sVar1,&local_6d8,"Mesh");
        std::__cxx11::string::~string((string *)&local_6d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f8,"Version",(allocator<char> *)((long)&p.property_start + 7));
        FBX::Node::AddChild<int>((Node *)local_648,&local_6f8,0xe8);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&p.property_start + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_790,"Properties70",&local_791);
        FBX::Node::Node((Node *)local_770,&local_790);
        std::__cxx11::string::~string((string *)&local_790);
        std::allocator<char>::~allocator(&local_791);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b8,"InheritType",(allocator<char> *)((long)&i_2 + 7));
        FBX::Node::AddP70enum((Node *)local_770,&local_7b8,1);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 7));
        FBX::Node::AddChild((Node *)local_648,(Node *)local_770);
        FBX::Node::Dump((Node *)local_648,(StreamWriterLE *)node_local,(bool)(this->binary & 1),1);
        FBX::Node::~Node((Node *)local_770);
        std::__cxx11::string::~string(local_690);
        FBX::Node::~Node((Node *)local_648);
      }
    }
    for (local_7c8 = 0; local_7c8 < *(uint *)(parent_uid_local + 0x450); local_7c8 = local_7c8 + 1)
    {
      WriteModelNodes(this,(StreamWriterLE *)node_local,
                      *(aiNode **)(*(long *)(parent_uid_local + 0x458) + local_7c8 * 8),
                      (int64_t)elem_1._M_node,limbnodes);
    }
  }
  else {
    std::__cxx11::string::find(local_58,0x101cee0);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&elem,(ulong)local_58);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
         ::find(&transform_types_abi_cxx11_,(key_type *)&elem);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
         ::end(&transform_types_abi_cxx11_);
    bVar6 = std::operator==(&local_a0,&local_a8);
    if (bVar6) {
      std::__cxx11::stringstream::stringstream(local_230);
      std::operator<<(local_220,"unrecognized FBX transformation node");
      poVar9 = std::operator<<(local_220," of type ");
      poVar9 = std::operator<<(poVar9,(string *)&elem);
      poVar9 = std::operator<<(poVar9," in node ");
      std::operator<<(poVar9,local_58);
      t.y._3_1_ = 1;
      pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      DeadlyImportError::DeadlyImportError(pDVar11,(string *)&t.z);
      t.y._3_1_ = 0;
      __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&r.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&s.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_278);
    aiMatrix4x4t<float>::Decompose
              ((aiMatrix4x4t<float> *)(parent_uid_local + 0x404),(aiVector3t<float> *)local_278,
               (aiVector3t<float> *)&s.y,(aiVector3t<float> *)&r.y);
    ppVar10 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
              ::operator->(&local_a0);
    uVar3 = node_name.field_2._8_8_;
    switch((ppVar10->second).second) {
    case 'i':
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_400);
      std::operator<<(local_3f0,"unrecognized FBX transformation type code: ");
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                ::operator->(&local_a0);
      std::operator<<(local_3f0,(ppVar10->second).second);
      pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      DeadlyImportError::DeadlyImportError(pDVar11,(string *)&i);
      __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    case 'r':
      aiVector3t<float>::operator*=((aiVector3t<float> *)&s.y,57.29578);
      uVar3 = node_name.field_2._8_8_;
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                ::operator->(&local_a0);
      std::
      vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
      ::emplace_back<std::__cxx11::string_const&,aiVector3t<float>&>
                ((vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
                  *)uVar3,&ppVar10->first,(aiVector3t<float> *)&s.y);
      break;
    case 's':
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                ::operator->(&local_a0);
      std::
      vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
      ::emplace_back<std::__cxx11::string_const&,aiVector3t<float>&>
                ((vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
                  *)uVar3,&ppVar10->first,(aiVector3t<float> *)local_278);
      break;
    case 't':
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                ::operator->(&local_a0);
      std::
      vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
      ::emplace_back<std::__cxx11::string_const&,aiVector3t<float>&>
                ((vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
                  *)uVar3,&ppVar10->first,(aiVector3t<float> *)&r.y);
    }
    for (local_428 = 0; local_428 < *(uint *)(parent_uid_local + 0x450); local_428 = local_428 + 1)
    {
      WriteModelNodes(this,(StreamWriterLE *)node_local,
                      *(aiNode **)(*(long *)(parent_uid_local + 0x458) + (ulong)local_428 * 8),
                      (int64_t)limbnodes_local,limbnodes,
                      (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
                       *)node_name.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)&elem);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void FBXExporter::WriteModelNodes(
    StreamWriterLE& outstream,
    const aiNode* node,
    int64_t parent_uid,
    const std::unordered_set<const aiNode*>& limbnodes,
    std::vector<std::pair<std::string,aiVector3D>>& transform_chain
) {
    // first collapse any expanded transformation chains created by FBX import.
    std::string node_name(node->mName.C_Str());
    if (node_name.find(MAGIC_NODE_TAG) != std::string::npos) {
        auto pos = node_name.find(MAGIC_NODE_TAG) + MAGIC_NODE_TAG.size() + 1;
        std::string type_name = node_name.substr(pos);
        auto elem = transform_types.find(type_name);
        if (elem == transform_types.end()) {
            // then this is a bug and should be fixed
            std::stringstream err;
            err << "unrecognized FBX transformation node";
            err << " of type " << type_name << " in node " << node_name;
            throw DeadlyExportError(err.str());
        }
        aiVector3D t, r, s;
        node->mTransformation.Decompose(s, r, t);
        switch (elem->second.second) {
        case 'i': // inverse
            // we don't need to worry about the inverse matrices
            break;
        case 't': // translation
            transform_chain.emplace_back(elem->first, t);
            break;
        case 'r': // rotation
            r *= float(DEG);
            transform_chain.emplace_back(elem->first, r);
            break;
        case 's': // scale
            transform_chain.emplace_back(elem->first, s);
            break;
        default:
            // this should never happen
            std::stringstream err;
            err << "unrecognized FBX transformation type code: ";
            err << elem->second.second;
            throw DeadlyExportError(err.str());
        }
        // now continue on to any child nodes
        for (unsigned i = 0; i < node->mNumChildren; ++i) {
            WriteModelNodes(
                outstream,
                node->mChildren[i],
                parent_uid,
                limbnodes,
                transform_chain
            );
        }
        return;
    }

    int64_t node_uid = 0;
    // generate uid and connect to parent, if not the root node,
    if (node != mScene->mRootNode) {
        auto elem = node_uids.find(node);
        if (elem != node_uids.end()) {
            node_uid = elem->second;
        } else {
            node_uid = generate_uid();
            node_uids[node] = node_uid;
        }
        connections.emplace_back("C", "OO", node_uid, parent_uid);
    }

    // what type of node is this?
    if (node == mScene->mRootNode) {
        // handled later
    } else if (node->mNumMeshes == 1) {
        // connect to child mesh, which should have been written previously
        connections.emplace_back(
            "C", "OO", mesh_uids[node->mMeshes[0]], node_uid
        );
        // also connect to the material for the child mesh
        connections.emplace_back(
            "C", "OO",
            material_uids[mScene->mMeshes[node->mMeshes[0]]->mMaterialIndex],
            node_uid
        );
        // write model node
        WriteModelNode(
            outstream, binary, node, node_uid, "Mesh", transform_chain
        );
    } else if (limbnodes.count(node)) {
        WriteModelNode(
            outstream, binary, node, node_uid, "LimbNode", transform_chain
        );
        // we also need to write a nodeattribute to mark it as a skeleton
        int64_t node_attribute_uid = generate_uid();
        FBX::Node na("NodeAttribute");
        na.AddProperties(
            node_attribute_uid, FBX::SEPARATOR + "NodeAttribute", "LimbNode"
        );
        na.AddChild("TypeFlags", FBXExportProperty("Skeleton"));
        na.Dump(outstream, binary, 1);
        // and connect them
        connections.emplace_back("C", "OO", node_attribute_uid, node_uid);
    } else {
        // generate a null node so we can add children to it
        WriteModelNode(
            outstream, binary, node, node_uid, "Null", transform_chain
        );
    }

    // if more than one child mesh, make nodes for each mesh
    if (node->mNumMeshes > 1 || node == mScene->mRootNode) {
        for (size_t i = 0; i < node->mNumMeshes; ++i) {
            // make a new model node
            int64_t new_node_uid = generate_uid();
            // connect to parent node
            connections.emplace_back("C", "OO", new_node_uid, node_uid);
            // connect to child mesh, which should have been written previously
            connections.emplace_back(
                "C", "OO", mesh_uids[node->mMeshes[i]], new_node_uid
            );
            // also connect to the material for the child mesh
            connections.emplace_back(
                "C", "OO",
                material_uids[
                    mScene->mMeshes[node->mMeshes[i]]->mMaterialIndex
                ],
                new_node_uid
            );
            // write model node
            FBX::Node m("Model");
            // take name from mesh name, if it exists
            std::string name = mScene->mMeshes[node->mMeshes[i]]->mName.C_Str();
            name += FBX::SEPARATOR + "Model";
            m.AddProperties(new_node_uid, name, "Mesh");
            m.AddChild("Version", int32_t(232));
            FBX::Node p("Properties70");
            p.AddP70enum("InheritType", 1);
            m.AddChild(p);
            m.Dump(outstream, binary, 1);
        }
    }

    // now recurse into children
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        WriteModelNodes(
            outstream, node->mChildren[i], node_uid, limbnodes
        );
    }
}